

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int ssh_sftp_do_select(_Bool include_stdin,_Bool no_fds_ok)

{
  undefined1 local_14;
  undefined1 local_13;
  int local_10;
  ssh_sftp_mainloop_ctx ctx [1];
  _Bool no_fds_ok_local;
  _Bool include_stdin_local;
  
  local_10 = 0;
  local_14 = include_stdin;
  local_13 = no_fds_ok;
  ctx[0]._2_1_ = no_fds_ok;
  ctx[0]._3_1_ = include_stdin;
  cli_main_loop(ssh_sftp_pw_setup,ssh_sftp_pw_check,ssh_sftp_mainloop_continue,&local_14);
  return local_10;
}

Assistant:

static int ssh_sftp_do_select(bool include_stdin, bool no_fds_ok)
{
    struct ssh_sftp_mainloop_ctx ctx[1];
    ctx->include_stdin = include_stdin;
    ctx->no_fds_ok = no_fds_ok;
    ctx->toret = 0;

    cli_main_loop(ssh_sftp_pw_setup, ssh_sftp_pw_check,
                  ssh_sftp_mainloop_continue, ctx);

    return ctx->toret;
}